

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cellml_1_0.cpp
# Opt level: O0

void __thiscall
ParserTransform_annotatedCellMl10Model_Test::~ParserTransform_annotatedCellMl10Model_Test
          (ParserTransform_annotatedCellMl10Model_Test *this)

{
  ParserTransform_annotatedCellMl10Model_Test *this_local;
  
  ~ParserTransform_annotatedCellMl10Model_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTransform, annotatedCellMl10Model)
{
    libcellml::ParserPtr parser = libcellml::Parser::create(false);
    auto model = parser->parseModel(fileContents("cellml1X/annotated_model.cellml"));

    EXPECT_EQ(size_t(5), model->unitsCount());
    EXPECT_EQ(size_t(2), model->componentCount());
    EXPECT_EQ(size_t(78), parser->issueCount());

    auto validator = libcellml::Validator::create();
    validator->validateModel(model);

    EXPECT_EQ(size_t(4), validator->issueCount());
}